

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_tools.cxx
# Opt level: O0

void __thiscall
db_unpacker::extract_1114(db_unpacker *this,string *prefix,string *mask,xr_reader *s,uint8_t *data)

{
  bool bVar1;
  xr_file_system *this_00;
  long lVar2;
  string *path_00;
  uint8_t *local_c0;
  uint8_t *p;
  size_t real_size;
  uint size;
  uint offset;
  uint uncompressed;
  undefined1 local_98 [8];
  string folder;
  string path;
  string temp;
  xr_file_system *fs;
  uint8_t *data_local;
  xr_reader *s_local;
  string *mask_local;
  string *prefix_local;
  db_unpacker *this_local;
  
  this_00 = xray_re::xr_file_system::instance();
  std::__cxx11::string::string((string *)(path.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(folder.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_98);
  while (bVar1 = xray_re::xr_reader::eof(s), ((bVar1 ^ 0xffU) & 1) != 0) {
    xray_re::xr_reader::r_sz(s,(string *)((long)&path.field_2 + 8));
    size = xray_re::xr_reader::r_u32(s);
    real_size._4_4_ = xray_re::xr_reader::r_u32(s);
    real_size._0_4_ = xray_re::xr_reader::r_u32(s);
    lVar2 = std::__cxx11::string::length();
    if (((lVar2 == 0) || (real_size._4_4_ == 0)) ||
       (lVar2 = std::__cxx11::string::find((string *)(folder.field_2._M_local_buf + 8),(ulong)mask),
       lVar2 != -1)) {
      std::__cxx11::string::operator=((string *)(folder.field_2._M_local_buf + 8),(string *)prefix);
      path_00 = (string *)std::__cxx11::string::append((string *)(folder.field_2._M_local_buf + 8));
      xray_re::xr_file_system::split_path(path_00,(string *)local_98,(string *)0x0,(string *)0x0);
      bVar1 = xray_re::xr_file_system::folder_exist((string *)local_98);
      if (!bVar1) {
        xray_re::xr_file_system::create_path(this_00,(string *)local_98);
      }
      if (size == 0) {
        xray_re::xr_lzhuf::decompress
                  (&local_c0,(size_t *)&p,data + real_size._4_4_,(ulong)(uint32_t)real_size);
        if (p != (uint8_t *)0x0) {
          write_file(this_00,(string *)((long)&folder.field_2 + 8),local_c0,(size_t)p);
        }
        free(local_c0);
      }
      else {
        write_file(this_00,(string *)((long)&folder.field_2 + 8),data + real_size._4_4_,
                   (ulong)(uint32_t)real_size);
      }
    }
  }
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)(folder.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(path.field_2._M_local_buf + 8));
  return;
}

Assistant:

void db_unpacker::extract_1114(const std::string& prefix, const std::string& mask, xr_reader* s, const uint8_t* data) const
{
	xr_file_system& fs = xr_file_system::instance();
	for (std::string temp, path, folder; !s->eof(); ) {
		s->r_sz(temp);
		unsigned uncompressed = s->r_u32();
		unsigned offset = s->r_u32();
		unsigned size = s->r_u32();

		if (mask.length() && (offset != 0))
		//if (path.compare(path.size()-mask.size(),mask.size(),mask) != 0)
		if (path.find(mask) == -1)
		continue;

		if (DB_DEBUG && fs.read_only()) {
			msg("%s", temp.c_str());
			msg("  offset: %u", offset);
			if (uncompressed)
				msg("  size (real): %u", size);
			else
				msg("  size (compressed): %u", size);
		} else {
			path = prefix;
			fs.split_path(path.append(temp), &folder);
			if (!fs.folder_exist(folder))
				fs.create_path(folder);
			if (uncompressed) {
				write_file(fs, path, data + offset, size);
			} else {
				size_t real_size;
				uint8_t* p;
				xr_lzhuf::decompress(p, real_size, data + offset, size);
				if (real_size)
					write_file(fs, path, p, real_size);
				free(p);
			}
		}
	}
}